

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LowpassSpeaker.hpp
# Opt level: O0

bool __thiscall
Outputs::Speaker::LowpassBase<Outputs::Speaker::PullLowpass<Enterprise::Dave::Audio>,_true>::process
          (LowpassBase<Outputs::Speaker::PullLowpass<Enterprise::Dave::Audio>,_true> *this,
          size_t length)

{
  size_t sVar1;
  bool bVar2;
  size_type sVar3;
  unsigned_long *puVar4;
  reference pvVar5;
  size_type sVar6;
  ulong local_50;
  size_t local_48;
  unsigned_long cycles_to_read;
  size_t local_38;
  unsigned_long samples_to_read;
  __pointer_type pDStack_28;
  int scale;
  __pointer_type delegate;
  size_t length_local;
  LowpassBase<Outputs::Speaker::PullLowpass<Enterprise::Dave::Audio>,_true> *this_local;
  
  delegate = (__pointer_type)length;
  length_local = (size_t)this;
  pDStack_28 = std::atomic<Outputs::Speaker::Speaker::Delegate_*>::load
                         (&(this->super_Speaker).delegate_,memory_order_relaxed);
  if (pDStack_28 == (__pointer_type)0x0) {
    this_local._7_1_ = false;
  }
  else {
    samples_to_read._4_4_ =
         PullLowpass<Enterprise::Dave::Audio>::get_scale
                   ((PullLowpass<Enterprise::Dave::Audio> *)this);
    bVar2 = recalculate_filter_if_dirty(this);
    if (bVar2) {
      (*pDStack_28->_vptr_Delegate[1])(pDStack_28,this);
    }
    if (this->conversion_ == ResampleSmaller) {
      for (; delegate != (__pointer_type)0x0; delegate = (__pointer_type)((long)delegate - local_48)
          ) {
        sVar3 = std::vector<short,_std::allocator<short>_>::size(&this->input_buffer_);
        local_50 = sVar3 - this->input_buffer_depth_ >> 1;
        puVar4 = std::min<unsigned_long>(&local_50,(unsigned_long *)&delegate);
        sVar1 = *puVar4;
        local_48 = sVar1;
        pvVar5 = std::vector<short,_std::allocator<short>_>::operator[]
                           (&this->input_buffer_,this->input_buffer_depth_);
        PullLowpass<Enterprise::Dave::Audio>::get_samples
                  ((PullLowpass<Enterprise::Dave::Audio> *)this,sVar1,pvVar5);
        this->input_buffer_depth_ = local_48 * 2 + this->input_buffer_depth_;
        sVar3 = this->input_buffer_depth_;
        sVar6 = std::vector<short,_std::allocator<short>_>::size(&this->input_buffer_);
        if (sVar3 == sVar6) {
          resample_input_buffer(this,samples_to_read._4_4_);
        }
      }
    }
    else if (this->conversion_ == Copy) {
      for (; delegate != (__pointer_type)0x0; delegate = (__pointer_type)((long)delegate - local_38)
          ) {
        sVar3 = std::vector<short,_std::allocator<short>_>::size(&this->output_buffer_);
        cycles_to_read = sVar3 - this->output_buffer_pointer_ >> 1;
        puVar4 = std::min<unsigned_long>(&cycles_to_read,(unsigned_long *)&delegate);
        sVar1 = *puVar4;
        local_38 = sVar1;
        pvVar5 = std::vector<short,_std::allocator<short>_>::operator[]
                           (&this->output_buffer_,this->output_buffer_pointer_);
        PullLowpass<Enterprise::Dave::Audio>::get_samples
                  ((PullLowpass<Enterprise::Dave::Audio> *)this,sVar1,pvVar5);
        this->output_buffer_pointer_ = local_38 * 2 + this->output_buffer_pointer_;
        sVar3 = this->output_buffer_pointer_;
        sVar6 = std::vector<short,_std::allocator<short>_>::size(&this->output_buffer_);
        if (sVar3 == sVar6) {
          this->output_buffer_pointer_ = 0;
          Speaker::did_complete_samples
                    (&this->super_Speaker,&this->super_Speaker,&this->output_buffer_,true);
        }
      }
    }
    this_local._7_1_ = true;
  }
  return this_local._7_1_;
}

Assistant:

bool process(size_t length) {
			const auto delegate = delegate_.load(std::memory_order::memory_order_relaxed);
			if(!delegate) return false;

			const int scale = static_cast<ConcreteT *>(this)->get_scale();

			if(recalculate_filter_if_dirty()) {
				delegate->speaker_did_change_input_clock(this);
			}

			switch(conversion_) {
				case Conversion::Copy:
					while(length) {
						const auto samples_to_read = std::min((output_buffer_.size() - output_buffer_pointer_) / (1 + is_stereo), length);
						static_cast<ConcreteT *>(this)->get_samples(samples_to_read, &output_buffer_[output_buffer_pointer_ ]);
						output_buffer_pointer_ += samples_to_read * (1 + is_stereo);

						// TODO: apply scale.

						// Announce to delegate if full.
						if(output_buffer_pointer_ == output_buffer_.size()) {
							output_buffer_pointer_ = 0;
							did_complete_samples(this, output_buffer_, is_stereo);
						}

						length -= samples_to_read;
					}
				break;

				case Conversion::ResampleSmaller:
					while(length) {
						const auto cycles_to_read = std::min((input_buffer_.size() - input_buffer_depth_) / (1 + is_stereo), length);
						static_cast<ConcreteT *>(this)->get_samples(cycles_to_read, &input_buffer_[input_buffer_depth_]);
						input_buffer_depth_ += cycles_to_read * (1 + is_stereo);

						if(input_buffer_depth_ == input_buffer_.size()) {
							resample_input_buffer(scale);
						}

						length -= cycles_to_read;
					}
				break;

				case Conversion::ResampleLarger:
					// TODO: input rate is less than output rate.
				break;
			}

			return true;
		}